

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall kj::Vector<kj::StringTree>::setCapacity(Vector<kj::StringTree> *this,size_t newSize)

{
  StringTree *pSVar1;
  RemoveConst<kj::StringTree> *pRVar2;
  StringTree *pSVar3;
  ulong uVar4;
  __off_t in_RDX;
  ArrayBuilder<kj::StringTree> local_48;
  
  uVar4 = ((long)(this->builder).pos - (long)(this->builder).ptr >> 3) * 0x6db6db6db6db6db7;
  if (newSize <= uVar4 && uVar4 - newSize != 0) {
    ArrayBuilder<kj::StringTree>::truncate(&this->builder,(char *)newSize,in_RDX);
  }
  local_48.ptr = (StringTree *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_48.endPtr = local_48.ptr + newSize;
  local_48.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_48.pos = kj::_::CopyConstructArray_<kj::StringTree,_kj::StringTree_*,_true,_false>::apply
                           (local_48.ptr,(this->builder).ptr,(this->builder).pos);
  ArrayBuilder<kj::StringTree>::operator=(&this->builder,&local_48);
  pSVar3 = local_48.endPtr;
  pRVar2 = local_48.pos;
  pSVar1 = local_48.ptr;
  if (local_48.ptr != (StringTree *)0x0) {
    local_48.ptr = (StringTree *)0x0;
    local_48.pos = (RemoveConst<kj::StringTree> *)0x0;
    local_48.endPtr = (StringTree *)0x0;
    (*(code *)**(undefined8 **)local_48.disposer)
              (local_48.disposer,pSVar1,0x38,((long)pRVar2 - (long)pSVar1 >> 3) * 0x6db6db6db6db6db7
               ,((long)pSVar3 - (long)pSVar1 >> 3) * 0x6db6db6db6db6db7,
               ArrayDisposer::Dispose_<kj::StringTree>::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }